

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void spvtools::val::anon_unknown_2::RegisterExtension
               (ValidationState_t *_,spv_parsed_instruction_t *inst)

{
  bool bVar1;
  char *str;
  spv_parsed_instruction_t *in_RDX;
  Extension local_3c;
  undefined1 local_38 [4];
  Extension extension;
  string extension_str;
  spv_parsed_instruction_t *inst_local;
  ValidationState_t *__local;
  
  extension_str.field_2._8_8_ = inst;
  GetExtensionString_abi_cxx11_((string *)local_38,(spvtools *)inst,in_RDX);
  str = (char *)std::__cxx11::string::c_str();
  bVar1 = GetExtensionFromString(str,&local_3c);
  if (bVar1) {
    ValidationState_t::RegisterExtension(_,local_3c);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void RegisterExtension(ValidationState_t& _,
                       const spv_parsed_instruction_t* inst) {
  const std::string extension_str = spvtools::GetExtensionString(inst);
  Extension extension;
  if (!GetExtensionFromString(extension_str.c_str(), &extension)) {
    // The error will be logged in the ProcessInstruction pass.
    return;
  }

  _.RegisterExtension(extension);
}